

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack8to1_int8.h
# Opt level: O0

void ncnn::conv1x1s1_sgemm_pack8to1_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined8 *in_RDI;
  Mat bottom_im2col;
  int size;
  int h;
  int w;
  Option *in_stack_00000ea0;
  Mat *in_stack_00000ea8;
  Mat *in_stack_00000eb0;
  Mat *in_stack_00000eb8;
  void *local_d8;
  int *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  long *local_b8;
  undefined4 local_b0;
  int local_ac;
  undefined4 local_a8;
  undefined4 local_a4;
  undefined4 local_a0;
  undefined8 local_98;
  int local_8c;
  int local_88;
  int local_84;
  void **local_60;
  int local_40;
  undefined4 local_3c;
  void **local_38;
  void **local_28;
  void *local_20;
  int local_10;
  undefined4 local_c;
  void **local_8;
  
  local_84 = *(int *)((long)in_RDI + 0x2c);
  local_88 = *(int *)(in_RDI + 6);
  local_ac = local_84 * local_88;
  local_28 = &local_d8;
  local_d8 = (void *)*in_RDI;
  local_d0 = (int *)in_RDI[1];
  local_c8 = in_RDI[2];
  local_c0 = *(undefined4 *)(in_RDI + 3);
  local_b8 = (long *)in_RDI[4];
  local_b0 = *(undefined4 *)(in_RDI + 5);
  local_a4 = *(undefined4 *)((long)in_RDI + 0x34);
  local_a0 = *(undefined4 *)(in_RDI + 7);
  local_98 = in_RDI[8];
  if (local_d0 != (int *)0x0) {
    local_c = 1;
    LOCK();
    local_10 = *local_d0;
    *local_d0 = *local_d0 + 1;
    UNLOCK();
  }
  local_a8 = 1;
  local_8c = local_ac;
  local_8 = local_28;
  im2col_sgemm_pack8to1_int8_sse
            (in_stack_00000eb8,in_stack_00000eb0,in_stack_00000ea8,in_stack_00000ea0);
  local_60 = &local_d8;
  if (local_d0 != (int *)0x0) {
    local_3c = 0xffffffff;
    LOCK();
    local_40 = *local_d0;
    *local_d0 = *local_d0 + -1;
    UNLOCK();
    if (local_40 == 1) {
      local_38 = local_60;
      if (local_b8 == (long *)0x0) {
        local_20 = local_d8;
        if (local_d8 != (void *)0x0) {
          free(local_d8);
        }
      }
      else {
        (**(code **)(*local_b8 + 0x18))(local_b8,local_d8);
      }
    }
  }
  return;
}

Assistant:

static void conv1x1s1_sgemm_pack8to1_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    const int size = w * h;

    Mat bottom_im2col = bottom_blob;
    bottom_im2col.w = size;
    bottom_im2col.h = 1;

    im2col_sgemm_pack8to1_int8_sse(bottom_im2col, top_blob, kernel, opt);
}